

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O2

int Gia_Iso2ManUniqify(Gia_Iso2Man_t *p)

{
  uint uVar1;
  int *piVar2;
  Gia_Man_t *pGVar3;
  int iVar4;
  int iVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pGVar7;
  ulong uVar8;
  size_t __nmemb;
  Vec_Int_t *pVVar9;
  long lVar10;
  int iVar11;
  
  piVar2 = p->vTable->pArray;
  uVar1 = p->vTable->nSize;
  p->vPlaces->nSize = 0;
  for (iVar11 = 0; iVar11 < p->vTied->nSize; iVar11 = iVar11 + 1) {
    pGVar3 = p->pGia;
    iVar4 = Vec_IntEntry(p->vTied,iVar11);
    pGVar6 = Gia_ManObj(pGVar3,iVar4);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    uVar8 = (ulong)pGVar6->Value % (ulong)uVar1;
    while( true ) {
      iVar4 = (int)uVar8;
      if (piVar2[iVar4] == 0) break;
      pGVar7 = Gia_ManObj(p->pGia,piVar2[iVar4]);
      if (pGVar7 == (Gia_Obj_t *)0x0) break;
      if (pGVar7->Value == pGVar6->Value) {
        pGVar7->field_0x3 = pGVar7->field_0x3 | 0x40;
        pGVar6->field_0x3 = pGVar6->field_0x3 | 0x40;
        goto LAB_005e148d;
      }
      uVar8 = (long)(iVar4 + 1) % (long)(int)uVar1 & 0xffffffff;
    }
    iVar5 = Gia_ObjId(p->pGia,pGVar6);
    piVar2[iVar4] = iVar5;
    Vec_IntPush(p->vPlaces,iVar4);
LAB_005e148d:
  }
  for (iVar11 = 0; iVar11 < p->vPlaces->nSize; iVar11 = iVar11 + 1) {
    iVar4 = Vec_IntEntry(p->vPlaces,iVar11);
    piVar2[iVar4] = 0;
  }
  p->vSingles->nSize = 0;
  iVar4 = 0;
  iVar11 = 0;
  do {
    pVVar9 = p->vTied;
    if (pVVar9->nSize <= iVar4) {
LAB_005e1533:
      Vec_IntShrink(pVVar9,iVar11);
      __nmemb = (size_t)p->vSingles->nSize;
      if (1 < (long)__nmemb) {
        qsort(p->vSingles->pArray,__nmemb,8,Gia_ObjCompareByValue2);
      }
      lVar10 = 0;
      while( true ) {
        iVar11 = p->vSingles->nSize;
        if (iVar11 <= lVar10) {
          return iVar11;
        }
        pGVar6 = (Gia_Obj_t *)p->vSingles->pArray[lVar10];
        pGVar6->Value = pGVar6->Value + s_256Primes[(byte)p->nUniques];
        pVVar9 = p->vUniques;
        iVar11 = Gia_ObjId(p->pGia,pGVar6);
        iVar11 = Vec_IntEntry(pVVar9,iVar11);
        if (iVar11 != -1) break;
        pVVar9 = p->vUniques;
        iVar4 = Gia_ObjId(p->pGia,pGVar6);
        iVar11 = p->nUniques;
        p->nUniques = iVar11 + 1;
        Vec_IntWriteEntry(pVVar9,iVar4,iVar11);
        lVar10 = lVar10 + 1;
      }
      __assert_fail("Vec_IntEntry(p->vUniques, Gia_ObjId(p->pGia, pObj)) == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso2.c"
                    ,0x150,"int Gia_Iso2ManUniqify(Gia_Iso2Man_t *)");
    }
    pGVar3 = p->pGia;
    iVar5 = Vec_IntEntry(pVVar9,iVar4);
    pGVar6 = Gia_ManObj(pGVar3,iVar5);
    if (pGVar6 == (Gia_Obj_t *)0x0) {
      pVVar9 = p->vTied;
      goto LAB_005e1533;
    }
    if (((uint)*(ulong *)pGVar6 >> 0x1e & 1) == 0) {
      Vec_PtrPush(p->vSingles,pGVar6);
    }
    else {
      *(ulong *)pGVar6 = *(ulong *)pGVar6 & 0xffffffffbfffffff;
      pVVar9 = p->vTied;
      iVar5 = Gia_ObjId(p->pGia,pGVar6);
      Vec_IntWriteEntry(pVVar9,iVar11,iVar5);
      iVar11 = iVar11 + 1;
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

int Gia_Iso2ManUniqify( Gia_Iso2Man_t * p )
{
    int fVerify = 0;
    Gia_Obj_t * pObj, * pTemp;
    int * pTable = Vec_IntArray(p->vTable);
    int i, k, nSize = Vec_IntSize(p->vTable);

    if ( fVerify )
        for ( k = 0; k < nSize; k++ )
            assert( pTable[k] == 0 );
    if ( fVerify )
        Gia_ManForEachObjVec( p->vTied, p->pGia, pObj, i )
            assert( pObj->fMark0 == 0 );

#if 0
    Gia_ManForEachObjVec( p->vTied, p->pGia, pObj, i )
    {
        printf( "%3d : ", Gia_ObjId(p->pGia, pObj) );
        Extra_PrintBinary( stdout, &pObj->Value, 32 );
        printf( "\n" );
    }
#endif

    // add objects to the table
    Vec_IntClear( p->vPlaces );
    Gia_ManForEachObjVec( p->vTied, p->pGia, pObj, i )
    {
        for ( k = pObj->Value % nSize; (pTemp = pTable[k] ? Gia_ManObj(p->pGia, pTable[k]) : NULL); k = (k + 1) % nSize )
            if ( pTemp->Value == pObj->Value )
            {
                pTemp->fMark0 = 1;
                pObj->fMark0 = 1;
                break;
            }
        if ( pTemp != NULL )
            continue;
        pTable[k] = Gia_ObjId(p->pGia, pObj);
        Vec_IntPush( p->vPlaces, k );
    }
    // clean the table
    Vec_IntForEachEntry( p->vPlaces, k, i )
        pTable[k] = 0;
    // collect singleton objects and compact tied objects
    k = 0;
    Vec_PtrClear( p->vSingles );
    Gia_ManForEachObjVec( p->vTied, p->pGia, pObj, i )
        if ( pObj->fMark0 == 0 )
            Vec_PtrPush( p->vSingles, pObj );
        else 
        {
            pObj->fMark0 = 0;
            Vec_IntWriteEntry( p->vTied, k++, Gia_ObjId(p->pGia, pObj) );
        }
    Vec_IntShrink( p->vTied, k );
    // sort singletons
    Vec_PtrSort( p->vSingles, (int (*)(void))Gia_ObjCompareByValue2 );
    // add them to unique and increment signature
    Vec_PtrForEachEntry( Gia_Obj_t *, p->vSingles, pObj, i )
    {
        pObj->Value += s_256Primes[p->nUniques & ISO_MASK];
        assert( Vec_IntEntry(p->vUniques, Gia_ObjId(p->pGia, pObj)) == -1 );
        Vec_IntWriteEntry( p->vUniques, Gia_ObjId(p->pGia, pObj), p->nUniques++ );
    }
    return Vec_PtrSize( p->vSingles );
}